

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entt.hpp
# Opt level: O0

void __thiscall
entt::basic_view<entt::entity,Model,Transform>::
traverse<Model,render_normal(entt::basic_registry<entt::entity>&)::__0,Transform,Model,Transform>
          (basic_view<entt::entity,Model,Transform> *this)

{
  anon_class_32_3_d0521327 __f;
  iterator __last;
  iterator __first;
  storage<entt::entity,_Model> **ppsVar1;
  anon_class_32_3_d0521327 local_98;
  basic_view<entt::entity,Model,Transform> *local_78;
  iterator_type local_70;
  anon_class_1_0_00000001 *local_60;
  direct_type *local_58;
  direct_type *local_50;
  direct_type *local_48;
  direct_type *local_40;
  undefined1 local_38 [8];
  iterator_type begin;
  iterator_type end;
  basic_view<entt::entity,_Model,_Transform> *this_local;
  
  ppsVar1 = std::
            get<entt::storage<entt::entity,Model>*,entt::storage<entt::entity,Model>*,entt::storage<entt::entity,Transform>*>
                      ((tuple<entt::storage<entt::entity,_Model>_*,_entt::storage<entt::entity,_Transform>_*>
                        *)this);
  join_0x00000010_0x00000000_ = sparse_set<entt::entity>::end((sparse_set<entt::entity> *)*ppsVar1);
  ppsVar1 = std::
            get<entt::storage<entt::entity,Model>*,entt::storage<entt::entity,Model>*,entt::storage<entt::entity,Transform>*>
                      ((tuple<entt::storage<entt::entity,_Model>_*,_entt::storage<entt::entity,_Transform>_*>
                        *)this);
  _local_38 = sparse_set<entt::entity>::begin((sparse_set<entt::entity> *)*ppsVar1);
  local_48 = (direct_type *)local_38;
  local_40 = begin.direct;
  local_58 = (direct_type *)begin.index;
  local_50 = end.direct;
  local_78 = this;
  ppsVar1 = std::
            get<entt::storage<entt::entity,Model>*,entt::storage<entt::entity,Model>*,entt::storage<entt::entity,Transform>*>
                      ((tuple<entt::storage<entt::entity,_Model>_*,_entt::storage<entt::entity,_Transform>_*>
                        *)this);
  local_70 = basic_storage<entt::entity,_Model,_void>::begin
                       (&(*ppsVar1)->super_basic_storage<entt::entity,_Model,_void>);
  local_60 = (anon_class_1_0_00000001 *)((long)&this_local + 7);
  __first.index = (index_type)local_40;
  __first.direct = local_48;
  __last.index = (index_type)local_50;
  __last.direct = local_58;
  __f.raw.instances = local_70.instances;
  __f.this = (basic_view<entt::entity,_Model,_Transform> *)local_78;
  __f.raw.index = local_70.index;
  __f.func = local_60;
  std::
  for_each<entt::sparse_set<entt::entity>::iterator,entt::basic_view<entt::entity,Model,Transform>::traverse<Model,render_normal(entt::basic_registry<entt::entity>&)::__0,Transform,Model,Transform>(render_normal(entt::basic_registry<entt::entity>&)::__0,entt::type_list<Transform>,entt::type_list<Model,Transform>)const::_lambda(auto:1)_1_>
            (&local_98,__first,__last,__f);
  return;
}

Assistant:

void traverse(Func func, type_list<Other...>, type_list<Type...>) const {
        const auto end = std::get<pool_type<Comp> *>(pools)->sparse_set<Entity>::end();
        auto begin = std::get<pool_type<Comp> *>(pools)->sparse_set<Entity>::begin();

        if constexpr(std::disjunction_v<std::is_same<Comp, Type>...>) {
            std::for_each(begin, end, [this, raw = std::get<pool_type<Comp> *>(pools)->begin(), &func](const auto entity) mutable {
                auto curr = raw++;

                if((std::get<pool_type<Other> *>(pools)->has(entity) && ...)) {
                    if constexpr(std::is_invocable_v<Func, decltype(get<Type>({}))...>) {
                        func(get<Comp, Type>(curr, std::get<pool_type<Type> *>(pools), entity)...);
                    } else {
                        func(entity, get<Comp, Type>(curr, std::get<pool_type<Type> *>(pools), entity)...);
                    }
                }
            });
        } else {
            std::for_each(begin, end, [this, &func](const auto entity) mutable {
                if((std::get<pool_type<Other> *>(pools)->has(entity) && ...)) {
                    if constexpr(std::is_invocable_v<Func, decltype(get<Type>({}))...>) {
                        func(std::get<pool_type<Type> *>(pools)->get(entity)...);
                    } else {
                        func(entity, std::get<pool_type<Type> *>(pools)->get(entity)...);
                    }
                }
            });
        }
    }